

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgGeneratorState.cpp
# Opt level: O0

void __thiscall
rsg::GeneratorState::GeneratorState
          (GeneratorState *this,ProgramParameters *programParams,Random *random)

{
  value_type_conflict1 local_38 [5];
  value_type_conflict2 local_24;
  Random *local_20;
  Random *random_local;
  ProgramParameters *programParams_local;
  GeneratorState *this_local;
  
  this->m_programParams = programParams;
  this->m_random = random;
  this->m_shaderParams = (ShaderParameters *)0x0;
  this->m_shader = (Shader *)0x0;
  local_20 = random;
  random_local = (Random *)programParams;
  programParams_local = (ProgramParameters *)this;
  NameAllocator::NameAllocator(&this->m_nameAllocator);
  this->m_varManager = (VariableManager *)0x0;
  this->m_statementStack = (vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *)0x0;
  this->m_expressionDepth = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_exprFlagStack);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_precedenceStack);
  local_24 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_exprFlagStack,&local_24);
  local_38[0] = 100;
  std::vector<int,_std::allocator<int>_>::push_back(&this->m_precedenceStack,local_38);
  return;
}

Assistant:

GeneratorState::GeneratorState (const ProgramParameters& programParams, de::Random& random)
	: m_programParams			(programParams)
	, m_random					(random)
	, m_shaderParams			(DE_NULL)
	, m_shader					(DE_NULL)
	, m_varManager				(DE_NULL)
	, m_statementStack			(DE_NULL)
	, m_expressionDepth			(0)
{
	m_exprFlagStack.push_back(0);
	m_precedenceStack.push_back(PRECEDENCE_MAX);
}